

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XDataAllocator.cpp
# Opt level: O3

void __thiscall Memory::XDataAllocator::ClearFreeList(XDataAllocator *this)

{
  XDataAllocationEntry *pXVar1;
  XDataAllocationEntry *buffer;
  
  buffer = this->freeList;
  while (buffer != (XDataAllocationEntry *)0x0) {
    pXVar1 = buffer->next;
    (buffer->super_XDataAllocation).super_SecondaryAllocation.address = (BYTE *)0x0;
    HeapAllocator::Free(&HeapAllocator::Instance,buffer,0x10);
    buffer = pXVar1;
  }
  this->freeList = (XDataAllocationEntry *)0x0;
  return;
}

Assistant:

void XDataAllocator::ClearFreeList()
{
    XDataAllocationEntry* next = this->freeList;
    XDataAllocationEntry* entry;
    while(next)
    {
        entry = next;
        next = entry->next;
        entry->address = nullptr;
        HeapDelete(entry);
    }
    this->freeList = NULL;
}